

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O2

void __thiscall
kj::_::BTreeImpl::rotateRight
          (BTreeImpl *this,Leaf *left,Leaf *right,Parent *parent,uint indexInParent)

{
  uint uVar1;
  
  *(undefined8 *)(right->rows + 1) = *(undefined8 *)right->rows;
  *(undefined8 *)(right->rows + 3) = *(undefined8 *)(right->rows + 2);
  uVar1 = right->rows[6].i;
  *(undefined8 *)(right->rows + 5) = *(undefined8 *)(right->rows + 4);
  right->rows[7].i = uVar1;
  uVar1 = Leaf::size(left);
  right->rows[0].i = left->rows[uVar1 - 1].i;
  parent->keys[indexInParent].i = left->rows[uVar1 - 2].i;
  left->rows[uVar1 - 1].i = 0;
  return;
}

Assistant:

void BTreeImpl::rotateRight(Leaf& left, Leaf& right, Parent& parent, uint indexInParent) {
  // Steal one item from the left node and move it to the right node.

  // Like mergeFrom(), this is only called on an exactly-half-empty node.
  KJ_DASSERT(right.isHalfFull());
  KJ_DASSERT(left.isMostlyFull());

  constexpr size_t mid = Leaf::NROWS/2;
  amove(right.rows + 1, right.rows, mid);

  uint back = left.size() - 1;

  right.rows[0] = left.rows[back];
  parent.keys[indexInParent] = left.rows[back - 1];
  left.rows[back] = nullptr;
}